

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall asmjit::_abi_1_10::Zone::reset(Zone *this,ResetPolicy resetPolicy)

{
  Block *pBVar1;
  Block *pBVar2;
  Block *pBVar3;
  
  pBVar2 = this->_block;
  if (pBVar2 != (Block *)_zeroBlock) {
    if (resetPolicy != kHard) {
      do {
        pBVar3 = pBVar2;
        pBVar2 = pBVar3->prev;
      } while (pBVar2 != (Block *)0x0);
      _assignBlock(this,pBVar3);
      return;
    }
    this->_ptr = (uint8_t *)
                 "/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zone.cpp"
    ;
    this->_end = (uint8_t *)
                 "/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zone.cpp"
    ;
    this->_block = (Block *)_zeroBlock;
    pBVar3 = pBVar2->next;
    do {
      pBVar1 = pBVar2->prev;
      if ((pBVar1 == (Block *)0x0) && (((this->field_3)._packedData & 0x1000000000000000) != 0)) {
        pBVar2->prev = (Block *)0x0;
        pBVar2->next = (Block *)0x0;
        _assignBlock(this,pBVar2);
        break;
      }
      free(pBVar2);
      pBVar2 = pBVar1;
    } while (pBVar1 != (Block *)0x0);
    while (pBVar3 != (Block *)0x0) {
      pBVar2 = pBVar3->next;
      free(pBVar3);
      pBVar3 = pBVar2;
    }
  }
  return;
}

Assistant:

void Zone::reset(ResetPolicy resetPolicy) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &_zeroBlock)
    return;

  if (resetPolicy == ResetPolicy::kHard) {
    Block* initial = const_cast<Zone::Block*>(&_zeroBlock);
    _ptr = initial->data();
    _end = initial->data();
    _block = initial;

    // Since cur can be in the middle of the double-linked list, we have to traverse both directions (`prev` and
    // `next`) separately to visit all.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;

      // If this is the first block and this ZoneTmp is temporary then the first block is statically allocated.
      // We cannot free it and it makes sense to keep it even when this is hard reset.
      if (prev == nullptr && _isTemporary) {
        cur->prev = nullptr;
        cur->next = nullptr;
        _assignBlock(cur);
        break;
      }

      ::free(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      ::free(cur);
      cur = next;
    }
  }
  else {
    while (cur->prev)
      cur = cur->prev;
    _assignBlock(cur);
  }
}